

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O2

void stackjit::ByteCodeGenerator::generateAttributes(ostream *stream,AttributeContainer *attributes)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar4;
  __node_base *p_Var5;
  __node_base *p_Var6;
  
  p_Var5 = &(attributes->_M_h)._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    poVar2 = std::operator<<(stream,"\t@");
    psVar3 = Loader::Attribute::name_abi_cxx11_((Attribute *)(p_Var5 + 5));
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"(");
    puVar4 = Loader::Attribute::values_abi_cxx11_((Attribute *)(p_Var5 + 5));
    p_Var6 = &(puVar4->_M_h)._M_before_begin;
    bVar1 = true;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      if (!bVar1) {
        std::operator<<(stream," ");
      }
      poVar2 = std::operator<<(stream,(string *)(p_Var6 + 1));
      poVar2 = std::operator<<(poVar2,"=");
      std::operator<<(poVar2,(string *)(p_Var6 + 5));
      bVar1 = false;
    }
    poVar2 = std::operator<<(stream,")");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void ByteCodeGenerator::generateAttributes(std::ostream& stream,
											   const Loader::AttributeContainer& attributes) {
		for (auto& current : attributes) {
			auto& attribute = current.second;
			stream << "\t@" << attribute.name() << "(";

			bool isFirst = true;
			for (auto& keyValue : attribute.values()) {
				if (!isFirst) {
					stream << " ";
				} else {
					isFirst = false;
				}

				stream << keyValue.first << "=" << keyValue.second;
			}

			stream << ")" << std::endl;
		}
	}